

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_defined_units.cpp
# Opt level: O2

void __thiscall
unitStringDefinitions_nonenglishVector_Test::unitStringDefinitions_nonenglishVector_Test
          (unitStringDefinitions_nonenglishVector_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_0015df10;
  return;
}

Assistant:

TEST(unitStringDefinitions, nonenglishVector)
{
    for (std::size_t ii = 0;
         ii < units::defined_unit_strings_non_english.size();
         ++ii) {
        EXPECT_TRUE(
            units::defined_unit_strings_non_english[ii].first != nullptr)
            << ii;
        if (units::defined_unit_strings_non_english[ii].first == nullptr) {
            break;
        }
    }
}